

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O0

LengthPercentage
Rml::ComputeMaxSize(Property *property,float font_size,float document_font_size,float dp_ratio,
                   Vector2f vp_dimensions)

{
  bool bVar1;
  Units UVar2;
  NumericValue value;
  float value_00;
  float local_44;
  float length;
  float dp_ratio_local;
  float document_font_size_local;
  float font_size_local;
  Property *property_local;
  Vector2f vp_dimensions_local;
  
  UVar2 = operator&(property->unit,KEYWORD);
  bVar1 = Any(UVar2);
  if (bVar1) {
    Style::LengthPercentage::LengthPercentage
              ((LengthPercentage *)&vp_dimensions_local,Length,3.4028235e+38);
  }
  else {
    UVar2 = operator&(property->unit,PERCENT);
    bVar1 = Any(UVar2);
    if (bVar1) {
      value_00 = Property::Get<float>(property);
      Style::LengthPercentage::LengthPercentage
                ((LengthPercentage *)&vp_dimensions_local,Percentage,value_00);
    }
    else {
      value = Property::GetNumericValue(property);
      local_44 = ComputeLength(value,font_size,document_font_size,dp_ratio,vp_dimensions);
      if (local_44 < 0.0) {
        local_44 = 3.4028235e+38;
      }
      Style::LengthPercentage::LengthPercentage
                ((LengthPercentage *)&vp_dimensions_local,Length,local_44);
    }
  }
  return (LengthPercentage)vp_dimensions_local;
}

Assistant:

Style::LengthPercentage ComputeMaxSize(const Property* property, float font_size, float document_font_size, float dp_ratio, Vector2f vp_dimensions)
{
	using namespace Style;
	if (Any(property->unit & Unit::KEYWORD))
		return LengthPercentage(LengthPercentage::Length, FLT_MAX);
	else if (Any(property->unit & Unit::PERCENT))
		return LengthPercentage(LengthPercentage::Percentage, property->Get<float>());

	const float length = ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions);
	return LengthPercentage(LengthPercentage::Length, length < 0.f ? FLT_MAX : length);
}